

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerWithAttr::SetEnumerable
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  ObjectSlotAttributes *instanceAttributes;
  code *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  PropertyIndex propertyIndex;
  BOOL BVar2;
  int iVar3;
  PropertyRecord *pPVar4;
  undefined4 extraout_var;
  
  propertyIndex =
       TypePath::LookupInline
                 ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.ptr,
                  propertyId,
                  (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                         super_DynamicTypeHandler.unusedBytes >> 1));
  if (propertyIndex == 0xffff) {
    if (value == 0) {
      bVar1 = DynamicObject::HasObjectArray(instance);
      if (bVar1) {
        pPVar4 = ScriptContext::GetPropertyName
                           ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr
                             )->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
        if (pPVar4->isNumeric == true) {
          iVar3 = (*(this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                    super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x48])(this,instance);
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x148);
          BVar2 = (*UNRECOVERED_JUMPTABLE)
                            ((long *)CONCAT44(extraout_var,iVar3),instance,propertyId,0,
                             UNRECOVERED_JUMPTABLE);
          return BVar2;
        }
      }
    }
    BVar2 = 1;
  }
  else {
    instanceAttributes = (this->attributes).ptr;
    BVar2 = PathTypeHandlerBase::SetAttributesHelper
                      ((PathTypeHandlerBase *)this,instance,propertyId,propertyIndex,
                       instanceAttributes,
                       instanceAttributes[propertyIndex] & ~ObjectSlotAttr_Enumerable | value != 0,
                       false);
  }
  return BVar2;
}

Assistant:

BOOL PathTypeHandlerWithAttr::SetEnumerable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        // Find the property
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            if (!value)
            {
                // Upgrade type handler if set objectArray item attribute.
                // Only check numeric propertyId if objectArray available.
                if (instance->HasObjectArray())
                {
                    PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
                    if (propertyRecord->IsNumeric())
                    {
                        return ConvertToTypeWithItemAttributes(instance)->SetEnumerable(instance, propertyId, value);
                    }
                }
            }
            return true;
        }

        ObjectSlotAttributes attr =
            (ObjectSlotAttributes)(value ? (attributes[propertyIndex] | ObjectSlotAttr_Enumerable) : (attributes[propertyIndex] & ~ObjectSlotAttr_Enumerable));
        return SetAttributesHelper(instance, propertyId, propertyIndex, attributes, attr);
    }